

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsproto.c
# Opt level: O3

int lsaveproto(lua_State *L)

{
  sproto *psVar1;
  ulong uVar2;
  
  psVar1 = (sproto *)lua_touserdata(L,1);
  uVar2 = luaL_optinteger(L,2,0);
  if (0xf < (uint)uVar2) {
    luaL_error(L,"Invalid global slot index %d",uVar2 & 0xffffffff);
  }
  G_sproto[(uint)uVar2 & 0xf] = psVar1;
  return 0;
}

Assistant:

static int
lsaveproto(lua_State *L) {
	struct sproto * sp = lua_touserdata(L, 1);
	int index = luaL_optinteger(L, 2, 0);
	if (index < 0 || index >= MAX_GLOBALSPROTO) {
		return luaL_error(L, "Invalid global slot index %d", index);
	}
	/* TODO : release old object (memory leak now, but thread safe)*/
	G_sproto[index] = sp;
	return 0;
}